

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlCheckCdataPush(xmlChar *utf,int len,int complete)

{
  byte bVar1;
  uint uVar2;
  int local_38;
  int local_34;
  int local_30;
  int codepoint;
  uchar c;
  int ix;
  int complete_local;
  int len_local;
  xmlChar *utf_local;
  
  if ((utf == (xmlChar *)0x0) || (len < 1)) {
    return 0;
  }
  codepoint = 0;
  do {
    while( true ) {
      while( true ) {
        if (len <= codepoint) {
          return codepoint;
        }
        bVar1 = utf[codepoint];
        if ((bVar1 & 0x80) != 0) break;
        if ((((bVar1 < 0x20) && (bVar1 != 10)) && (bVar1 != 0xd)) && (bVar1 != 9)) {
          return -codepoint;
        }
        codepoint = codepoint + 1;
      }
      if ((bVar1 & 0xe0) == 0xc0) break;
      if ((bVar1 & 0xf0) == 0xe0) {
        if (len < codepoint + 3) {
          if (complete == 0) {
            local_34 = codepoint;
          }
          else {
            local_34 = -codepoint;
          }
          return local_34;
        }
        if (((utf[codepoint + 1] & 0xc0) != 0x80) || ((utf[codepoint + 2] & 0xc0) != 0x80)) {
          return -codepoint;
        }
        uVar2 = utf[codepoint + 2] & 0x3f |
                (utf[codepoint + 1] & 0x3f) << 6 | (utf[codepoint] & 0xf) << 0xc;
        if (uVar2 < 0x100) {
          if (((uVar2 < 9) || (10 < uVar2)) && ((uVar2 != 0xd && (uVar2 < 0x20)))) {
LAB_0018e633:
            return -codepoint;
          }
        }
        else if ((((uVar2 < 0x100) || (0xd7ff < uVar2)) && ((uVar2 < 0xe000 || (0xfffd < uVar2))))
                && ((uVar2 < 0x10000 || (0x10ffff < uVar2)))) goto LAB_0018e633;
        codepoint = codepoint + 3;
      }
      else {
        if ((bVar1 & 0xf8) != 0xf0) {
          return -codepoint;
        }
        if (len < codepoint + 4) {
          if (complete == 0) {
            local_38 = codepoint;
          }
          else {
            local_38 = -codepoint;
          }
          return local_38;
        }
        if ((((utf[codepoint + 1] & 0xc0) != 0x80) || ((utf[codepoint + 2] & 0xc0) != 0x80)) ||
           ((utf[codepoint + 3] & 0xc0) != 0x80)) {
          return -codepoint;
        }
        uVar2 = utf[codepoint + 3] & 0x3f |
                (utf[codepoint + 2] & 0x3f) << 6 |
                (utf[codepoint + 1] & 0x3f) << 0xc | (utf[codepoint] & 7) << 0x12;
        if (uVar2 < 0x100) {
          if (((uVar2 < 9) || (10 < uVar2)) && ((uVar2 != 0xd && (uVar2 < 0x20)))) {
LAB_0018e7bf:
            return -codepoint;
          }
        }
        else if ((((uVar2 < 0x100) || (0xd7ff < uVar2)) && ((uVar2 < 0xe000 || (0xfffd < uVar2))))
                && ((uVar2 < 0x10000 || (0x10ffff < uVar2)))) goto LAB_0018e7bf;
        codepoint = codepoint + 4;
      }
    }
    if (len < codepoint + 2) {
      if (complete == 0) {
        local_30 = codepoint;
      }
      else {
        local_30 = -codepoint;
      }
      return local_30;
    }
    if ((utf[codepoint + 1] & 0xc0) != 0x80) {
      return -codepoint;
    }
    uVar2 = utf[codepoint + 1] & 0x3f | (utf[codepoint] & 0x1f) << 6;
    if (uVar2 < 0x100) {
      if (((uVar2 < 9) || (10 < uVar2)) && ((uVar2 != 0xd && (uVar2 < 0x20)))) {
LAB_0018e4e1:
        return -codepoint;
      }
    }
    else if ((((uVar2 < 0x100) || (0xd7ff < uVar2)) && ((uVar2 < 0xe000 || (0xfffd < uVar2)))) &&
            ((uVar2 < 0x10000 || (0x10ffff < uVar2)))) goto LAB_0018e4e1;
    codepoint = codepoint + 2;
  } while( true );
}

Assistant:

static int
xmlCheckCdataPush(const xmlChar *utf, int len, int complete) {
    int ix;
    unsigned char c;
    int codepoint;

    if ((utf == NULL) || (len <= 0))
        return(0);

    for (ix = 0; ix < len;) {      /* string is 0-terminated */
        c = utf[ix];
        if ((c & 0x80) == 0x00) {	/* 1-byte code, starts with 10 */
	    if (c >= 0x20)
		ix++;
	    else if ((c == 0xA) || (c == 0xD) || (c == 0x9))
	        ix++;
	    else
	        return(-ix);
	} else if ((c & 0xe0) == 0xc0) {/* 2-byte code, starts with 110 */
	    if (ix + 2 > len) return(complete ? -ix : ix);
	    if ((utf[ix+1] & 0xc0 ) != 0x80)
	        return(-ix);
	    codepoint = (utf[ix] & 0x1f) << 6;
	    codepoint |= utf[ix+1] & 0x3f;
	    if (!xmlIsCharQ(codepoint))
	        return(-ix);
	    ix += 2;
	} else if ((c & 0xf0) == 0xe0) {/* 3-byte code, starts with 1110 */
	    if (ix + 3 > len) return(complete ? -ix : ix);
	    if (((utf[ix+1] & 0xc0) != 0x80) ||
	        ((utf[ix+2] & 0xc0) != 0x80))
		    return(-ix);
	    codepoint = (utf[ix] & 0xf) << 12;
	    codepoint |= (utf[ix+1] & 0x3f) << 6;
	    codepoint |= utf[ix+2] & 0x3f;
	    if (!xmlIsCharQ(codepoint))
	        return(-ix);
	    ix += 3;
	} else if ((c & 0xf8) == 0xf0) {/* 4-byte code, starts with 11110 */
	    if (ix + 4 > len) return(complete ? -ix : ix);
	    if (((utf[ix+1] & 0xc0) != 0x80) ||
	        ((utf[ix+2] & 0xc0) != 0x80) ||
		((utf[ix+3] & 0xc0) != 0x80))
		    return(-ix);
	    codepoint = (utf[ix] & 0x7) << 18;
	    codepoint |= (utf[ix+1] & 0x3f) << 12;
	    codepoint |= (utf[ix+2] & 0x3f) << 6;
	    codepoint |= utf[ix+3] & 0x3f;
	    if (!xmlIsCharQ(codepoint))
	        return(-ix);
	    ix += 4;
	} else				/* unknown encoding */
	    return(-ix);
      }
      return(ix);
}